

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::handle_const&>
          (pybind11 *this,object *args_,handle *args__1)

{
  PyObject *pPVar1;
  undefined8 uVar2;
  object *poVar3;
  cast_error *this_00;
  long lVar4;
  array<pybind11::object,_2UL> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  argtypes;
  
  pPVar1 = (args_->super_handle).m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    args._M_elems[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    args._M_elems[0] = (object)(args_->super_handle).m_ptr;
  }
  pPVar1 = args__1->m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    args._M_elems[1].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    args._M_elems[1].super_handle.m_ptr = (handle)args__1->m_ptr;
  }
  poVar3 = args._M_elems;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == -0x40) {
      tuple::tuple((tuple *)this,2);
      lVar4 = 0;
      while( true ) {
        if (lVar4 == 0x10) {
          std::array<pybind11::object,_2UL>::~array(&args);
          return (object)(object)this;
        }
        uVar2 = *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar4);
        *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar4) = 0;
        if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) break;
        *(undefined8 *)(*(long *)this + 0x18 + lVar4) = uVar2;
        lVar4 = lVar4 + 8;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                    ,0x6f2,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::object &, const pybind11::handle &>]"
                   );
    }
    if ((((object *)&poVar3->super_handle)->super_handle).m_ptr == (PyObject *)0x0) break;
    lVar4 = lVar4 + -0x20;
    poVar3 = poVar3 + 1;
  }
  type_id<pybind11::object&>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(argtypes._M_elems + 1),"N8pybind116handleE",(allocator<char> *)&local_a0);
  detail::clean_type_id(argtypes._M_elems + 1);
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_80,"make_tuple(): unable to convert argument of type \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&argtypes - lVar4));
  std::operator+(&local_a0,&local_80,"\' to Python object");
  cast_error::runtime_error(this_00,&local_a0);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}